

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::NegativeVertexAttribDivisor::Run(NegativeVertexAttribDivisor *this)

{
  GLenum GVar1;
  undefined8 in_RAX;
  CallLogWrapper *this_00;
  char *format;
  GLint p;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8869,&local_14);
  glu::CallLogWrapper::glVertexBindingDivisor(this_00,local_14 + 1,1);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    glu::CallLogWrapper::glVertexBindingDivisor(this_00,0,1);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar1 == 0x502) {
      return 0;
    }
    format = "INVALID_OPERATION should be generated.\n";
  }
  else {
    format = "INVALID_VALUE should be generated.\n";
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		glBindVertexArray(m_vao);
		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &p);
		glVertexBindingDivisor(p + 1, 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glBindVertexArray(0);
		glVertexBindingDivisor(0, 1);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		return NO_ERROR;
	}